

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O1

void save_deblock_boundary_lines
               (YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,int plane,int row,int stripe,int use_highbd
               ,int is_above,RestorationStripeBoundaries *boundaries)

{
  int src_stride;
  uint rows;
  byte bVar1;
  uint uVar2;
  uint8_t *puVar3;
  uint uVar4;
  int width;
  long lVar5;
  uint dst_stride;
  ulong uVar6;
  ulong uVar7;
  uint8_t *puVar8;
  uint8_t *buf;
  int height;
  ulong uVar9;
  int local_48;
  
  uVar9 = (ulong)(0 < plane);
  puVar8 = (uint8_t *)((long)frame->store_buf_adr[(long)plane + -4] * 2);
  if (use_highbd == 0) {
    puVar8 = frame->store_buf_adr[(long)plane + -4];
  }
  src_stride = *(int *)((long)frame->store_buf_adr + uVar9 * 4 + -0x28);
  bVar1 = (byte)use_highbd;
  lVar5 = (long)(src_stride << (bVar1 & 0x1f));
  puVar8 = puVar8 + lVar5 * row;
  uVar2 = *(uint *)((long)frame->store_buf_adr + uVar9 * 4 + -0x30);
  uVar7 = (ulong)uVar2;
  dst_stride = boundaries->stripe_boundary_stride;
  uVar6 = (ulong)dst_stride;
  height = dst_stride << (bVar1 & 0x1f);
  buf = (&boundaries->stripe_boundary_above)[is_above == 0] +
        (long)(stripe * height * 2) + (long)(4 << (bVar1 & 0x1f));
  uVar4 = uVar2 - row;
  rows = 2;
  if ((int)uVar4 < 2) {
    rows = uVar4;
  }
  if (cm->width == cm->superres_upscaled_width) {
    width = *(int *)((long)frame->store_buf_adr + uVar9 * 4 + -0x38);
    local_48 = width << (bVar1 & 0x1f);
    if (0 < (int)uVar4) {
      uVar9 = 1;
      puVar3 = buf;
      if (1 < (int)rows) {
        uVar9 = (ulong)rows;
      }
      do {
        memcpy(puVar3,puVar8,(long)local_48);
        uVar2 = (uint)uVar7;
        dst_stride = (uint)uVar6;
        puVar8 = puVar8 + lVar5;
        uVar9 = uVar9 - 1;
        puVar3 = puVar3 + height;
      } while (uVar9 != 0);
    }
  }
  else {
    if (plane < 1) {
      uVar2 = 0;
    }
    else {
      uVar2 = (uint)(cm->seq_params->subsampling_x != 0);
    }
    width = (int)(cm->superres_upscaled_width + uVar2) >> (sbyte)uVar2;
    local_48 = width << (bVar1 & 0x1f);
    puVar3 = buf;
    if (use_highbd != 0) {
      puVar8 = (uint8_t *)((ulong)puVar8 >> 1);
      puVar3 = (uint8_t *)((ulong)buf >> 1);
    }
    uVar2 = plane;
    av1_upscale_normative_rows(cm,puVar8,src_stride,puVar3,dst_stride,plane,rows);
  }
  if (uVar4 == 1) {
    memcpy(buf + height,buf,(long)local_48);
  }
  extend_lines(buf,width,height,use_highbd,dst_stride,uVar2);
  return;
}

Assistant:

static void save_deblock_boundary_lines(
    const YV12_BUFFER_CONFIG *frame, const AV1_COMMON *cm, int plane, int row,
    int stripe, int use_highbd, int is_above,
    RestorationStripeBoundaries *boundaries) {
  const int is_uv = plane > 0;
  const uint8_t *src_buf = REAL_PTR(use_highbd, frame->buffers[plane]);
  const int src_stride = frame->strides[is_uv] << use_highbd;
  const uint8_t *src_rows = src_buf + row * (ptrdiff_t)src_stride;

  uint8_t *bdry_buf = is_above ? boundaries->stripe_boundary_above
                               : boundaries->stripe_boundary_below;
  uint8_t *bdry_start = bdry_buf + (RESTORATION_EXTRA_HORZ << use_highbd);
  const int bdry_stride = boundaries->stripe_boundary_stride << use_highbd;
  uint8_t *bdry_rows = bdry_start + RESTORATION_CTX_VERT * stripe * bdry_stride;

  // There is a rare case in which a processing stripe can end 1px above the
  // crop border. In this case, we do want to use deblocked pixels from below
  // the stripe (hence why we ended up in this function), but instead of
  // fetching 2 "below" rows we need to fetch one and duplicate it.
  // This is equivalent to clamping the sample locations against the crop border
  const int lines_to_save =
      AOMMIN(RESTORATION_CTX_VERT, frame->crop_heights[is_uv] - row);
  assert(lines_to_save == 1 || lines_to_save == 2);

  int upscaled_width;
  int line_bytes;
  if (av1_superres_scaled(cm)) {
    const int ss_x = is_uv && cm->seq_params->subsampling_x;
    upscaled_width = (cm->superres_upscaled_width + ss_x) >> ss_x;
    line_bytes = upscaled_width << use_highbd;
    if (use_highbd)
      av1_upscale_normative_rows(
          cm, CONVERT_TO_BYTEPTR(src_rows), frame->strides[is_uv],
          CONVERT_TO_BYTEPTR(bdry_rows), boundaries->stripe_boundary_stride,
          plane, lines_to_save);
    else
      av1_upscale_normative_rows(cm, src_rows, frame->strides[is_uv], bdry_rows,
                                 boundaries->stripe_boundary_stride, plane,
                                 lines_to_save);
  } else {
    upscaled_width = frame->crop_widths[is_uv];
    line_bytes = upscaled_width << use_highbd;
    for (int i = 0; i < lines_to_save; i++) {
      memcpy(bdry_rows + i * bdry_stride, src_rows + i * src_stride,
             line_bytes);
    }
  }
  // If we only saved one line, then copy it into the second line buffer
  if (lines_to_save == 1)
    memcpy(bdry_rows + bdry_stride, bdry_rows, line_bytes);

  extend_lines(bdry_rows, upscaled_width, RESTORATION_CTX_VERT, bdry_stride,
               RESTORATION_EXTRA_HORZ, use_highbd);
}